

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall
Qentem::
Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
::resize(Array<Qentem::TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::LoopItem>
         *this,SizeT new_size)

{
  LoopItem *from;
  LoopItem *to;
  
  from = this->storage_;
  this->capacity_ = new_size;
  to = allocate(this);
  Memory::Copy<unsigned_int>(to,from,this->index_ * 0x18);
  if (from != (LoopItem *)0x0) {
    MemoryRecord::RemoveAllocation(from);
  }
  operator_delete(from);
  return;
}

Assistant:

void resize(SizeT new_size) {
        constexpr SizeT32 type_size = sizeof(Type_T);
        Type_T           *src       = Storage();

        setCapacity(new_size);

        Type_T *des = allocate();
        Memory::Copy(des, src, (Size() * type_size));
        Memory::Deallocate(src);
    }